

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conn.cpp
# Opt level: O0

void __thiscall Conn::run(Conn *this)

{
  __pid_t _Var1;
  epoll_event *cur_ev_00;
  epoll_event *cur_ev;
  int i;
  int nfds;
  Conn *this_local;
  
  Epoll::add_event(&this->_epoll,this->_listen_fd,1);
  do {
    _Var1 = Epoll::wait(&this->_epoll,(void *)0x3e8);
    for (cur_ev._0_4_ = 0; (int)cur_ev < _Var1; cur_ev._0_4_ = (int)cur_ev + 1) {
      cur_ev_00 = Epoll::get(&this->_epoll,(int)cur_ev);
      handle(this,cur_ev_00);
    }
  } while( true );
}

Assistant:

void Conn::run()
{
    _epoll.add_event(_listen_fd, EPOLLIN);

    while (true)
    {
        int nfds = _epoll.wait(kWaitMS);
        // LOG_PRINT("epoll wait get ready %d fds", nfds);

        for (int i = 0; i < nfds; ++i)
        {
            struct epoll_event &cur_ev = _epoll.get(i);
            handle(cur_ev);
        }
    }
}